

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::BuildResult(Clipper *this,Paths *polys)

{
  long *plVar1;
  _func_int **pp_Var2;
  cInt cVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong __n;
  ulong uVar7;
  Path pg;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_48;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(polys,*(long *)(this->_vptr_Clipper[-3] +
                           (long)&(this->m_Maxima).
                                  super__List_base<long_long,_std::allocator<long_long>_>) -
                  *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]) >> 3);
  pp_Var2 = this->_vptr_Clipper;
  lVar5 = *(long *)((long)&this->m_ClipType + (long)pp_Var2[-3]);
  if (*(long *)(pp_Var2[-3] +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) !=
      lVar5) {
    uVar7 = 0;
    do {
      if (*(long *)(*(long *)(lVar5 + uVar7 * 8) + 0x18) != 0) {
        local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
        local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
        lVar5 = *(long *)(*(long *)(*(long *)(*(long *)((long)&this->m_ClipType + (long)pp_Var2[-3])
                                             + uVar7 * 8) + 0x18) + 0x20);
        __n = 0;
        lVar4 = lVar5;
        if (lVar5 != 0) {
          do {
            __n = (ulong)((int)__n + 1);
            plVar1 = (long *)(lVar4 + 0x18);
            lVar4 = *plVar1;
          } while (*plVar1 != lVar5);
        }
        if (1 < (int)__n) {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                    (&local_48,__n);
          do {
            if (local_48.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_48.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
              _M_realloc_insert<ClipperLib::IntPoint_const&>
                        ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                         &local_48,
                         (iterator)
                         local_48.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(IntPoint *)(lVar5 + 8));
            }
            else {
              cVar3 = *(cInt *)(lVar5 + 0x10);
              (local_48.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->X = ((IntPoint *)(lVar5 + 8))->X;
              (local_48.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->Y = cVar3;
              local_48.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_48.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar5 = *(long *)(lVar5 + 0x20);
            uVar6 = (int)__n - 1;
            __n = (ulong)uVar6;
          } while (uVar6 != 0);
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(polys,&local_48);
        }
        if (local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      uVar7 = uVar7 + 1;
      pp_Var2 = this->_vptr_Clipper;
      lVar5 = *(long *)((long)&this->m_ClipType + (long)pp_Var2[-3]);
    } while (uVar7 < (ulong)(*(long *)(pp_Var2[-3] +
                                      (long)&(this->m_Maxima).
                                             super__List_base<long_long,_std::allocator<long_long>_>
                                      ) - lVar5 >> 3));
  }
  return;
}

Assistant:

void Clipper::BuildResult(Paths &polys)
{
  polys.reserve(m_PolyOuts.size());
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    if (!m_PolyOuts[i]->Pts) continue;
    Path pg;
    OutPt* p = m_PolyOuts[i]->Pts->Prev;
    int cnt = PointCount(p);
    if (cnt < 2) continue;
    pg.reserve(cnt);
    for (int i = 0; i < cnt; ++i)
    {
      pg.push_back(p->Pt);
      p = p->Prev;
    }
    polys.push_back(pg);
  }
}